

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2crossing_edge_query.cc
# Opt level: O3

void __thiscall
S2CrossingEdgeQuery::GetCandidates
          (S2CrossingEdgeQuery *this,S2Point *a0,S2Point *a1,S2Shape *shape,
          vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_> *edges)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  __normal_iterator<s2shapeutil::ShapeEdgeId_*,_std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>_>
  _Var4;
  pointer pSVar5;
  pointer pSVar6;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  pSVar6 = (edges->
           super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((edges->
      super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>).
      _M_impl.super__Vector_impl_data._M_finish != pSVar6) {
    (edges->super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>)
    ._M_impl.super__Vector_impl_data._M_finish = pSVar6;
  }
  iVar2 = (*shape->_vptr_S2Shape[2])(shape);
  if (iVar2 < 0x1c) {
    std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>::reserve
              (edges,(long)iVar2);
  }
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<bool_(const_s2shapeutil::ShapeEdgeId_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2crossing_edge_query.cc:141:37)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(const_s2shapeutil::ShapeEdgeId_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2crossing_edge_query.cc:141:37)>
             ::_M_manager;
  local_48._M_unused._M_object = edges;
  VisitRawCandidates(this,a0,a1,shape,(ShapeEdgeIdVisitor *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  pSVar6 = (edges->
           super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar5 = (edges->
           super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  uVar3 = (long)pSVar5 - (long)pSVar6 >> 3;
  if (1 < uVar3) {
    if (pSVar6 != pSVar5) {
      lVar1 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<s2shapeutil::ShapeEdgeId*,std::vector<s2shapeutil::ShapeEdgeId,std::allocator<s2shapeutil::ShapeEdgeId>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pSVar6,pSVar5,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<s2shapeutil::ShapeEdgeId*,std::vector<s2shapeutil::ShapeEdgeId,std::allocator<s2shapeutil::ShapeEdgeId>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pSVar6,pSVar5);
      pSVar6 = (edges->
               super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pSVar5 = (edges->
               super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    _Var4 = std::
            __unique<__gnu_cxx::__normal_iterator<s2shapeutil::ShapeEdgeId*,std::vector<s2shapeutil::ShapeEdgeId,std::allocator<s2shapeutil::ShapeEdgeId>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (pSVar6,pSVar5);
    if (_Var4._M_current !=
        (edges->
        super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      (edges->
      super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>).
      _M_impl.super__Vector_impl_data._M_finish = _Var4._M_current;
    }
  }
  return;
}

Assistant:

void S2CrossingEdgeQuery::GetCandidates(const S2Point& a0, const S2Point& a1,
                                        const S2Shape& shape,
                                        vector<ShapeEdgeId>* edges) {
  edges->clear();
  int num_edges = shape.num_edges();
  if (num_edges <= kMaxBruteForceEdges) {
    edges->reserve(num_edges);
  }
  VisitRawCandidates(a0, a1, shape, [edges](ShapeEdgeId id) {
      edges->push_back(id);
      return true;
    });
  if (edges->size() > 1) {
    std::sort(edges->begin(), edges->end());
    edges->erase(std::unique(edges->begin(), edges->end()), edges->end());
  }
}